

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData
          (SparseTextureClampLookupResidencyTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,FunctionToken *funcToken)

{
  undefined1 *puVar1;
  pointer pcVar2;
  GLint GVar3;
  _Alloc_hider _Var4;
  pointer puVar5;
  GLenum GVar6;
  ostream *poVar7;
  size_t sVar8;
  TestError *this_00;
  int iVar9;
  int sample;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  size_type __new_size;
  GLint depth;
  GLuint verifyTexture;
  GLint height;
  GLint width;
  int local_6f0;
  allocator<char> local_6ea;
  allocator<char> local_6e9;
  SparseTexture2LookupTestCase *local_6e8;
  GLint local_6dc;
  pointer local_6d8;
  int local_6d0;
  GLenum local_6cc;
  GLint local_6c8;
  GLuint fbo;
  ostream *local_6c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string fragment;
  string vertex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  value_type local_628;
  ShaderProgram program;
  FunctionToken f;
  ProgramSources sources;
  TokenStringsExt s;
  
  puVar1 = &(this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
            super_SparseTextureCommitmentTestCase.field_0x88;
  local_6dc = format;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"Verify Lookup Residency Texture Data [function: ",0x30);
  local_6c0 = (ostream *)puVar1;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(funcToken->name)._M_dataplus._M_p,
                      (funcToken->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", level: ",9);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] - ",4);
  if ((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
      super_SparseTextureCommitmentTestCase.mState.levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x121);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_6c8 = level;
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2LookupTestCase).
                     super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
                     mState,level,&width,&height,&depth);
  GVar3 = width;
  bVar12 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2LookupTestCase).super_SparseTexture2CommitmentTestCase.
      super_SparseTextureCommitmentTestCase.mState.minDepth <= depth)) {
    if (target == 0x8513) {
      depth = depth * 6;
    }
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __new_size = (size_type)(height * width);
    local_6e8 = &this->super_SparseTexture2LookupTestCase;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,__new_size);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,__new_size);
    puVar5 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_6d8 = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
    memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,0xff,__new_size);
    f.name._M_dataplus._M_p = (pointer)&f.name.field_2;
    pcVar2 = (funcToken->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f,pcVar2,pcVar2 + (funcToken->name)._M_string_length);
    f.arguments._M_dataplus._M_p = (pointer)&f.arguments.field_2;
    pcVar2 = (funcToken->arguments)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&f.arguments,pcVar2,pcVar2 + (funcToken->arguments)._M_string_length);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&f.allowedTargets._M_t,&(funcToken->allowedTargets)._M_t);
    gl4cts::Texture::Generate(gl,&verifyTexture);
    gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
    gl4cts::Texture::Storage(gl,0xde1,1,0x8229,width,height,depth);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Texture::Storage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x148);
    (*gl->genFramebuffers)(1,&fbo);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glGenFramebuffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x14c);
    (*gl->bindFramebuffer)(0x8d40,fbo);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x14e);
    (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,verifyTexture,0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glFramebufferTexture2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x150);
    (*gl->viewport)(0,0,width,height);
    if (depth < 1) {
      bVar12 = true;
    }
    else {
      local_6d0 = GVar3 / 2;
      bVar12 = true;
      local_6f0 = 0;
      local_6cc = target;
      do {
        if (0 < (((SparseTexture2LookupTestCase *)&local_6e8->super_SparseTexture2CommitmentTestCase
                 )->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
                mState.samples) {
          sample = 0;
          do {
            memset(local_6d8,0,__new_size);
            gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
            gl4cts::Texture::SubImage(gl,0xde1,0,0,0,0,width,height,0,0x1903,0x1401,local_6d8);
            GVar6 = (*gl->getError)();
            glu::checkError(GVar6,"Texture::SubImage",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                            ,0x15d);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vertex,stc_vertex_common,(allocator<char> *)&s);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fragment,stc_fragment_lookupResidency,(allocator<char> *)&s);
            SparseTexture2LookupTestCase::createLookupShaderTokens
                      (&s,local_6e8,target,local_6dc,local_6c8,sample,&f);
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&vertex);
            replaceToken("<FUNCTION>",f.name._M_dataplus._M_p,&fragment);
            replaceToken("<ARGUMENTS>",f.arguments._M_dataplus._M_p,&fragment);
            replaceToken("<OUTPUT_TYPE>",s.super_TokenStrings.outputType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<INPUT_TYPE>",s.super_TokenStrings.inputType._M_dataplus._M_p,&fragment);
            replaceToken("<SIZE_DEF>",s.sizeDef._M_dataplus._M_p,&fragment);
            replaceToken("<LOD>",s.lod._M_dataplus._M_p,&fragment);
            replaceToken("<LOD_DEF>",s.lodDef._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_TYPE>",s.coordType._M_dataplus._M_p,&fragment);
            replaceToken("<ICOORD_TYPE>",s.iCoordType._M_dataplus._M_p,&fragment);
            replaceToken("<COORD_DEF>",s.coordDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_TYPE>",s.super_TokenStrings.pointType._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_DEF>",s.super_TokenStrings.pointDef._M_dataplus._M_p,&fragment);
            replaceToken("<RETURN_TYPE>",s.super_TokenStrings.returnType._M_dataplus._M_p,&fragment)
            ;
            replaceToken("<RESULT_EXPECTED>",s.super_TokenStrings.resultExpected._M_dataplus._M_p,
                         &fragment);
            replaceToken("<EPSILON>",s.super_TokenStrings.epsilon._M_dataplus._M_p,&fragment);
            replaceToken("<SAMPLE_DEF>",s.super_TokenStrings.sampleDef._M_dataplus._M_p,&fragment);
            replaceToken("<REFZ_DEF>",s.refZDef._M_dataplus._M_p,&fragment);
            replaceToken("<POINT_COORD>",s.pointCoord._M_dataplus._M_p,&fragment);
            replaceToken("<COMPONENT_DEF>",s.componentDef._M_dataplus._M_p,&fragment);
            replaceToken("<CUBE_MAP_COORD_DEF>",s.cubeMapCoordDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_ARRAY_DEF>",s.offsetArrayDef._M_dataplus._M_p,&fragment);
            replaceToken("<FORMAT_DEF>",s.formatDef._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_TYPE>",s.offsetType._M_dataplus._M_p,&fragment);
            replaceToken("<NOFFSET_TYPE>",s.nOffsetType._M_dataplus._M_p,&fragment);
            replaceToken("<OFFSET_DIM>",s.offsetDim._M_dataplus._M_p,&fragment);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,width);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_WIDTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,height);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_HEIGHT>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&sources);
            std::ostream::operator<<(&sources,depth);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sources);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &sources.sources[4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            replaceToken("<TEX_DEPTH>",
                         (GLchar *)
                         program.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start,&fragment);
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&program,vertex._M_dataplus._M_p,&local_6e9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_628,fragment._M_dataplus._M_p,&local_6ea);
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            sources._193_8_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
            sources.transformFeedbackVaryings.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
            memset(&sources,0,0xac);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources,(value_type *)&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(sources.sources + 1,&local_628);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_628._M_dataplus._M_p != &local_628.field_2) {
              operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1
                             );
            }
            if (program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
              operator_delete(program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)program.m_shaders[0].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            glu::ShaderProgram::ShaderProgram
                      (&program,((((SparseTexture2LookupTestCase *)
                                  &local_6e8->super_SparseTexture2CommitmentTestCase)->
                                 super_SparseTexture2CommitmentTestCase).
                                 super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                                m_renderCtx,&sources);
            if (program.m_program.m_info.linkOk == true) {
              (*gl->useProgram)(program.m_program.m_program);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUseProgram",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x18d);
              (*gl->activeTexture)(0x84c0);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glActiveTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x191);
              (*gl->uniform1i)(1,0);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x193);
              (*gl->uniform1i)(2,local_6d0);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glUniform1i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x197);
              (*gl->bindTexture)(target,*texture);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"glBindTexture",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x19a);
              (*gl->clear)(0x4100);
              (**(code **)((long)(((SparseTexture2LookupTestCase *)
                                  &local_6e8->super_SparseTexture2CommitmentTestCase)->
                                 super_SparseTexture2CommitmentTestCase).
                                 super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase
                                 .super_TestNode._vptr_TestNode + 0xa0))
                        (local_6e8,target,local_6f0,&program);
              gl4cts::Texture::Bind(gl,verifyTexture,0xde1);
              gl4cts::Texture::GetData(gl,0,0xde1,0x1903,0x1401,local_6d8);
              GVar6 = (*gl->getError)();
              glu::checkError(GVar6,"Texture::GetData",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                              ,0x1a1);
              if (0 < (long)height) {
                iVar9 = 0;
                lVar10 = 0;
                do {
                  if (0 < width) {
                    uVar11 = 0;
                    do {
                      if (puVar5[uVar11 + (long)iVar9] != local_6d8[uVar11 + (long)iVar9]) {
                        bVar12 = false;
                      }
                      uVar11 = uVar11 + 1;
                    } while ((uint)width != uVar11);
                  }
                  lVar10 = lVar10 + 1;
                  iVar9 = iVar9 + width;
                } while (lVar10 != height);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_6c0,"Shader compilation failed (lookup residency) for target: ",0x39)
              ;
              poVar7 = (ostream *)std::ostream::operator<<(local_6c0,target);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", format: ",10);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_6dc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", vertexInfoLog: ",0x11);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,((*program.m_shaders[0].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[0].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", fragmentInfoLog: ",0x13);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,((*program.m_shaders[1].
                                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                         infoLog._M_dataplus._M_p,
                                  ((*program.m_shaders[1].
                                     super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                  _M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", programInfoLog: ",0x12);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,program.m_program.m_info.infoLog._M_dataplus._M_p,
                                  program.m_program.m_info.infoLog._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", fragmentSource: ",0x12);
              _Var4 = fragment._M_dataplus;
              if (fragment._M_dataplus._M_p == (pointer)0x0) {
                std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
              }
              else {
                sVar8 = strlen(fragment._M_dataplus._M_p);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,_Var4._M_p,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
              bVar12 = false;
            }
            glu::ShaderProgram::~ShaderProgram(&program);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&sources.transformFeedbackVaryings);
            std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
            ~vector(&sources.attribLocationBindings);
            lVar10 = 0x78;
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&sources.sources[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10));
              lVar10 = lVar10 + -0x18;
            } while (lVar10 != -0x18);
            SparseTexture2LookupTestCase::TokenStringsExt::~TokenStringsExt(&s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fragment._M_dataplus._M_p != &fragment.field_2) {
              operator_delete(fragment._M_dataplus._M_p,fragment.field_2._M_allocated_capacity + 1);
            }
            target = local_6cc;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vertex._M_dataplus._M_p != &vertex.field_2) {
              operator_delete(vertex._M_dataplus._M_p,vertex.field_2._M_allocated_capacity + 1);
            }
            sample = sample + 1;
          } while (sample < (((SparseTexture2LookupTestCase *)
                             &local_6e8->super_SparseTexture2CommitmentTestCase)->
                            super_SparseTexture2CommitmentTestCase).
                            super_SparseTextureCommitmentTestCase.mState.samples);
        }
        local_6f0 = local_6f0 + 1;
      } while (local_6f0 < depth);
    }
    (*gl->bindFramebuffer)(0x8d40,0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"glBindFramebuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                    ,0x1bb);
    gl4cts::Texture::Delete(gl,&verifyTexture);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&f.allowedTargets._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.arguments._M_dataplus._M_p != &f.arguments.field_2) {
      operator_delete(f.arguments._M_dataplus._M_p,f.arguments.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)f.name._M_dataplus._M_p != &f.name.field_2) {
      operator_delete(f.name._M_dataplus._M_p,f.name.field_2._M_allocated_capacity + 1);
    }
    if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecOutData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar12;
}

Assistant:

bool SparseTextureClampLookupResidencyTestCase::verifyLookupTextureData(const Functions& gl, GLint target, GLint format,
																		GLuint& texture, GLint level,
																		FunctionToken& funcToken)
{
	mLog << "Verify Lookup Residency Texture Data [function: " << funcToken.name << ", level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = depth * 6;

	GLint texSize = width * height;

	std::vector<GLubyte> vecExpData;
	std::vector<GLubyte> vecOutData;
	vecExpData.resize(texSize);
	vecOutData.resize(texSize);
	GLubyte* exp_data = vecExpData.data();
	GLubyte* out_data = vecOutData.data();

	// Expected data is 255 because
	deMemset(exp_data, 255, texSize);

	// Make token copy to work on
	FunctionToken f = funcToken;

	// Create verifying texture
	GLint  verifyTarget = GL_TEXTURE_2D;
	GLuint verifyTexture;
	Texture::Generate(gl, verifyTexture);
	Texture::Bind(gl, verifyTexture, verifyTarget);
	Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, verifyTarget, verifyTexture, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D");

	gl.viewport(0, 0, width, height);

	for (GLint z = 0; z < depth; ++z)
	{
		for (int sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, 0, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string vertex   = stc_vertex_common;
			std::string fragment = stc_fragment_lookupResidency;

			// Adjust shader source to texture format
			TokenStringsExt s = createLookupShaderTokens(target, format, level, sample, f);

			replaceToken("<COORD_TYPE>", s.coordType.c_str(), vertex);

			replaceToken("<FUNCTION>", f.name.c_str(), fragment);
			replaceToken("<ARGUMENTS>", f.arguments.c_str(), fragment);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), fragment);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), fragment);
			replaceToken("<SIZE_DEF>", s.sizeDef.c_str(), fragment);
			replaceToken("<LOD>", s.lod.c_str(), fragment);
			replaceToken("<LOD_DEF>", s.lodDef.c_str(), fragment);
			replaceToken("<COORD_TYPE>", s.coordType.c_str(), fragment);
			replaceToken("<ICOORD_TYPE>", s.iCoordType.c_str(), fragment);
			replaceToken("<COORD_DEF>", s.coordDef.c_str(), fragment);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), fragment);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), fragment);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), fragment);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), fragment);
			replaceToken("<EPSILON>", s.epsilon.c_str(), fragment);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), fragment);
			replaceToken("<REFZ_DEF>", s.refZDef.c_str(), fragment);
			replaceToken("<POINT_COORD>", s.pointCoord.c_str(), fragment);
			replaceToken("<COMPONENT_DEF>", s.componentDef.c_str(), fragment);
			replaceToken("<CUBE_MAP_COORD_DEF>", s.cubeMapCoordDef.c_str(), fragment);
			replaceToken("<OFFSET_ARRAY_DEF>", s.offsetArrayDef.c_str(), fragment);
			replaceToken("<FORMAT_DEF>", s.formatDef.c_str(), fragment);
			replaceToken("<OFFSET_TYPE>", s.offsetType.c_str(), fragment);
			replaceToken("<NOFFSET_TYPE>", s.nOffsetType.c_str(), fragment);
			replaceToken("<OFFSET_DIM>", s.offsetDim.c_str(), fragment);

			replaceToken("<TEX_WIDTH>", de::toString(width).c_str(), fragment);
			replaceToken("<TEX_HEIGHT>", de::toString(height).c_str(), fragment);
			replaceToken("<TEX_DEPTH>", de::toString(depth).c_str(), fragment);

			ProgramSources sources = makeVtxFragSources(vertex.c_str(), fragment.c_str());

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");

				// Pass input sampler/image to shader
				gl.activeTexture(GL_TEXTURE0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture");
				gl.uniform1i(1, 0 /* sampler_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				// Pass committed region width to shader
				gl.uniform1i(2, widthCommitted /* committed region width */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");

				gl.bindTexture(target, texture);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture");

				gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				draw(target, z, program);

				Texture::Bind(gl, verifyTexture, verifyTarget);
				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint y = 0; y < height; ++y)
					for (GLint x = 0; x < width; ++x)
					{
						GLubyte* dataRegion	= exp_data + x + y * width;
						GLubyte* outDataRegion = out_data + x + y * width;
						if (dataRegion[0] != outDataRegion[0])
							result = false;
					}
			}
			else
			{
				mLog << "Shader compilation failed (lookup residency) for target: " << target << ", format: " << format
					 << ", vertexInfoLog: " << program.getShaderInfo(SHADERTYPE_VERTEX).infoLog
					 << ", fragmentInfoLog: " << program.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog
					 << ", programInfoLog: " << program.getProgramInfo().infoLog
					 << ", fragmentSource: " << fragment.c_str() << " - ";

				result = false;
			}
		}
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer");

	Texture::Delete(gl, verifyTexture);

	return result;
}